

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  sqlite3_vfs *psVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  void *pvVar8;
  _func_void *p_Var9;
  char *pcVar10;
  ulong uVar11;
  void **__s;
  char *pcVar12;
  byte *pbVar13;
  uint uVar14;
  long lVar15;
  uchar uVar16;
  uchar uVar17;
  uint uVar18;
  int iVar19;
  void *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar4 = db->pVfs;
  local_38 = (void *)0x0;
  if (zFile == (char *)0x0) {
    uVar18 = 0;
  }
  else {
    uVar18 = 0xffffffff;
    pcVar7 = zFile;
    do {
      uVar18 = uVar18 + 1;
      cVar2 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar2 != '\0');
    uVar18 = uVar18 & 0x3fffffff;
  }
  if (pzErrMsg == (char **)0x0) {
    iVar6 = 1;
    if ((db->flags & 0x200000) == 0) goto LAB_001247be;
LAB_00124479:
    iVar19 = uVar18 + 300;
    pcVar7 = "sqlite3_extension_init";
    if (zProc != (char *)0x0) {
      pcVar7 = zProc;
    }
    pvVar8 = (*psVar4->xDlOpen)(psVar4,zFile);
    if (pvVar8 == (void *)0x0) {
      pcVar10 = sqlite3_mprintf("%s.%s",zFile,"so");
      if (pcVar10 != (char *)0x0) {
        pvVar8 = (*psVar4->xDlOpen)(psVar4,pcVar10);
        sqlite3_free(pcVar10);
        if (pvVar8 == (void *)0x0) {
          iVar6 = 1;
          if (pzErrMsg != (char **)0x0) {
            iVar5 = sqlite3_initialize();
            if (iVar5 == 0) {
              pcVar7 = (char *)sqlite3Malloc(iVar19);
              *pzErrMsg = pcVar7;
              if (pcVar7 != (char *)0x0) {
                sqlite3_snprintf(iVar19,pcVar7,"unable to open shared library [%s]",zFile);
                (*psVar4->xDlError)(psVar4,uVar18 + 299,pcVar7);
              }
            }
            else {
              *pzErrMsg = (char *)0x0;
            }
          }
          goto LAB_001247be;
        }
        goto LAB_001244a9;
      }
LAB_001246c3:
      iVar6 = 7;
      goto LAB_001247be;
    }
LAB_001244a9:
    p_Var9 = (*psVar4->xDlSym)(psVar4,pvVar8,pcVar7);
    uVar18 = 0;
    if (zProc == (char *)0x0 && p_Var9 == (_func_void *)0x0) {
      if (zFile != (char *)0x0) {
        uVar18 = 0xffffffff;
        pcVar7 = zFile;
        do {
          uVar18 = uVar18 + 1;
          cVar2 = *pcVar7;
          pcVar7 = pcVar7 + 1;
        } while (cVar2 != '\0');
        uVar18 = uVar18 & 0x3fffffff;
      }
      iVar6 = sqlite3_initialize();
      if ((iVar6 != 0) || (pcVar7 = (char *)sqlite3Malloc(uVar18 + 0x1e), pcVar7 == (char *)0x0)) {
        (*psVar4->xDlClose)(psVar4,pvVar8);
        goto LAB_001246c3;
      }
      builtin_strncpy(pcVar7,"sqlite3_",8);
      uVar11 = (ulong)uVar18;
      do {
        if ((long)uVar11 < 1) {
          uVar18 = 0;
          goto LAB_001246fe;
        }
        uVar1 = uVar11 - 1;
        lVar15 = uVar11 - 1;
        uVar11 = uVar1;
      } while (zFile[lVar15] != '/');
      uVar18 = (int)uVar1 + 1;
LAB_001246fe:
      lVar15 = 0;
      do {
        if ((ulong)(byte)zFile[lVar15 + (ulong)uVar18] == 0) {
          uVar17 = ""[(byte)"lib"[lVar15]];
          uVar16 = '\0';
LAB_001247f5:
          uVar14 = uVar18 + 3;
          if (uVar16 != uVar17) {
            uVar14 = uVar18;
          }
          goto LAB_00124802;
        }
        uVar16 = ""[(byte)zFile[lVar15 + (ulong)uVar18]];
        uVar17 = ""[(byte)"lib"[lVar15]];
        if (uVar16 != uVar17) goto LAB_001247f5;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      uVar14 = uVar18 + 3;
LAB_00124802:
      iVar6 = 8;
      for (pbVar13 = (byte *)(zFile + (int)uVar14);
          (bVar3 = *pbVar13, bVar3 != 0 && (bVar3 != 0x2e)); pbVar13 = pbVar13 + 1) {
        if ((""[bVar3] & 2) != 0) {
          lVar15 = (long)iVar6;
          iVar6 = iVar6 + 1;
          pcVar7[lVar15] = ""[(uint)(int)(char)bVar3];
        }
      }
      (pcVar7 + (long)iVar6 + 4)[0] = 't';
      (pcVar7 + (long)iVar6 + 4)[1] = '\0';
      builtin_strncpy(pcVar7 + iVar6,"_ini",4);
      p_Var9 = (*psVar4->xDlSym)(psVar4,pvVar8,pcVar7);
      pcVar10 = pcVar7;
    }
    else {
      pcVar10 = (char *)0x0;
    }
    if (p_Var9 == (_func_void *)0x0) {
      if (pzErrMsg != (char **)0x0) {
        lVar15 = 0;
        do {
          pcVar12 = pcVar7 + lVar15;
          lVar15 = lVar15 + 1;
        } while (*pcVar12 != '\0');
        iVar6 = sqlite3_initialize();
        if (iVar6 == 0) {
          iVar19 = ((int)lVar15 - 1U & 0x3fffffff) + iVar19;
          pcVar12 = (char *)sqlite3Malloc(iVar19);
          *pzErrMsg = pcVar12;
          if (pcVar12 != (char *)0x0) {
            sqlite3_snprintf(iVar19,pcVar12,"no entry point [%s] in shared library [%s]",pcVar7,
                             zFile);
            (*psVar4->xDlError)(psVar4,iVar19 + -1,pcVar12);
          }
        }
        else {
          *pzErrMsg = (char *)0x0;
        }
      }
      (*psVar4->xDlClose)(psVar4,pvVar8);
      sqlite3_free(pcVar10);
    }
    else {
      sqlite3_free(pcVar10);
      iVar6 = (*p_Var9)(db,&local_38,&sqlite3Apis);
      if (iVar6 == 0) {
        iVar19 = db->nExtension * 8 + 8;
        __s = (void **)sqlite3DbMallocRaw(db,iVar19);
        if (__s != (void **)0x0) {
          iVar6 = 0;
          memset(__s,0,(long)iVar19);
          if (0 < (long)db->nExtension) {
            memcpy(__s,db->aExtension,(long)db->nExtension << 3);
          }
          sqlite3DbFree(db,db->aExtension);
          db->aExtension = __s;
          iVar19 = db->nExtension;
          db->nExtension = iVar19 + 1;
          __s[iVar19] = pvVar8;
          goto LAB_001247be;
        }
        goto LAB_001246c3;
      }
      if (pzErrMsg != (char **)0x0) {
        pcVar7 = sqlite3_mprintf("error during initialization: %s",local_38);
        *pzErrMsg = pcVar7;
      }
      sqlite3_free(local_38);
      (*psVar4->xDlClose)(psVar4,pvVar8);
    }
  }
  else {
    *pzErrMsg = (char *)0x0;
    if ((db->flags & 0x200000) != 0) goto LAB_00124479;
    pcVar7 = sqlite3_mprintf("not authorized");
    *pzErrMsg = pcVar7;
  }
  iVar6 = 1;
LAB_001247be:
  iVar6 = sqlite3ApiExit(db,iVar6);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}